

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<float,_1,1,0,_1,1>>
               (Matrix<float,__1,_1,_0,__1,_1> *dst,Matrix<float,__1,__1,_0,__1,__1> *lhs,
               Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *rhs,
               Scalar *alpha)

{
  long cols;
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  char *__function;
  float fVar4;
  const_blas_data_mapper<float,_long,_1> local_20;
  const_blas_data_mapper<float,_long,_0> local_10;
  
  local_10.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride =
       (lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  cols = (lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (local_10.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride != 1) {
    local_20.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data =
         (rhs->
         super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         ).m_data;
    local_10.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
         (lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    local_20.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride = 1;
    general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_false,_0>
    ::run(local_10.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride,cols,&local_10,
          &local_20,
          (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data,1,
          *alpha);
    return;
  }
  pfVar1 = (lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  if (cols < 0 && pfVar1 != (float *)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>, Level = 0]"
    ;
  }
  else {
    pfVar2 = (rhs->
             super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             ).m_data;
    lVar3 = (rhs->
            super_MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
            ).m_rows.m_value;
    if (-1 < lVar3 || pfVar2 == (float *)0x0) {
      if (cols != lVar3) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>, OtherDerived = Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, 1>>, -1, 1, true>]"
                     );
      }
      if (cols == 0) {
        fVar4 = 0.0;
      }
      else {
        if (cols < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>>, const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, 1>>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, 1>>, const Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, 1>>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                       );
        }
        fVar4 = *pfVar1 * *pfVar2;
        if (cols != 1) {
          lVar3 = 1;
          do {
            fVar4 = fVar4 + pfVar1[lVar3] * pfVar2[lVar3];
            lVar3 = lVar3 + 1;
          } while (cols != lVar3);
        }
      }
      pfVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      *pfVar1 = *alpha * fVar4 + *pfVar1;
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, 1>>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Map<const Eigen::Matrix<float, -1, 1>>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }